

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitLoad(ParseNode *lhs,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  RegSlot Instance;
  RegSlot RVar2;
  ParseNode *pnode;
  Symbol *sym;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  PropertyId propertySlot;
  uint cacheId;
  ParseNodeCall *pnodeCall;
  undefined4 *puVar6;
  ParseNodeBin *pPVar7;
  ParseNodeName *pPVar8;
  ParseNodeSuperCall *pnodeSuperCall;
  
  OVar1 = lhs->nop;
  if (OVar1 < knopDot) {
    if (OVar1 == knopName) {
      FuncInfo::AcquireLoc(funcInfo,lhs);
      RVar2 = lhs->location;
      pPVar8 = ParseNode::AsParseNodeName(lhs);
      sym = pPVar8->sym;
      pPVar8 = ParseNode::AsParseNodeName(lhs);
      ByteCodeGenerator::EmitPropLoad(byteCodeGenerator,RVar2,sym,pPVar8->pid,funcInfo,false);
      return;
    }
    if (OVar1 != knopCall) {
LAB_00810acd:
      FuncInfo::AcquireLoc(funcInfo,lhs);
      Emit(lhs,byteCodeGenerator,funcInfo,0,false,false);
      return;
    }
    pnodeCall = ParseNode::AsParseNodeCall(lhs);
    if ((pnodeCall->field_0x24 & 8) != 0) {
      FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
      EmitReference(&pnodeCall->super_ParseNode,byteCodeGenerator,funcInfo);
      pnodeSuperCall = ParseNode::AsParseNodeSuperCall(&pnodeCall->super_ParseNode);
      ByteCodeGenerator::EmitSuperCall(byteCodeGenerator,funcInfo,pnodeSuperCall,0,0);
      return;
    }
    if (pnodeCall->pnodeTarget->nop == knopImport) {
      pnode = pnodeCall->pnodeArgs;
      uVar5 = CountArguments(pnode,(BOOL *)0x0);
      if (uVar5 != 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1cd3,"(CountArguments(args) == 2)","CountArguments(args) == 2");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
      FuncInfo::ReleaseLoc(funcInfo,pnode);
      FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
      Js::ByteCodeWriter::Reg2
                (&byteCodeGenerator->m_writer,ImportCall,(pnodeCall->super_ParseNode).location,
                 pnode->location);
      return;
    }
    FuncInfo::AcquireLoc(funcInfo,&pnodeCall->super_ParseNode);
    EmitReference(&pnodeCall->super_ParseNode,byteCodeGenerator,funcInfo);
    EmitCall(pnodeCall,byteCodeGenerator,funcInfo,0,0,0xffffffff,0xffffffff);
  }
  else if (OVar1 == knopDot) {
    pPVar7 = ParseNode::AsParseNodeBin(lhs);
    pPVar8 = ParseNode::AsParseNodeName(pPVar7->pnode2);
    propertySlot = ParseNodeName::PropertyIdFromNameNode(pPVar8);
    FuncInfo::AcquireLoc(funcInfo,lhs);
    EmitReference(lhs,byteCodeGenerator,funcInfo);
    pPVar7 = ParseNode::AsParseNodeBin(lhs);
    cacheId = FuncInfo::FindOrAddInlineCacheId
                        (funcInfo,pPVar7->pnode1->location,propertySlot,false,false);
    RVar2 = lhs->location;
    pPVar7 = ParseNode::AsParseNodeBin(lhs);
    Js::ByteCodeWriter::PatchableProperty
              (&byteCodeGenerator->m_writer,LdFld,RVar2,pPVar7->pnode1->location,cacheId,false,true)
    ;
  }
  else {
    if (OVar1 != knopIndex) goto LAB_00810acd;
    FuncInfo::AcquireLoc(funcInfo,lhs);
    EmitReference(lhs,byteCodeGenerator,funcInfo);
    RVar2 = lhs->location;
    pPVar7 = ParseNode::AsParseNodeBin(lhs);
    Instance = pPVar7->pnode1->location;
    pPVar7 = ParseNode::AsParseNodeBin(lhs);
    Js::ByteCodeWriter::Element
              (&byteCodeGenerator->m_writer,LdElemI_A,RVar2,Instance,pPVar7->pnode2->location,false,
               false);
  }
  return;
}

Assistant:

void EmitLoad(
    ParseNode *lhs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    // Emit the instructions to load the value into the LHS location. Do not assign/free any temps
    // in the process.
    // We usually get here as part of an op-equiv expression: x.y += z;
    // In such a case, x has to be emitted first, then the value of x.y loaded (by this function), then z emitted.
    switch (lhs->nop)
    {

        // load of a local or global variable
    case knopName:
    {
        funcInfo->AcquireLoc(lhs);
        byteCodeGenerator->EmitPropLoad(lhs->location, lhs->AsParseNodeName()->sym, lhs->AsParseNodeName()->pid, funcInfo);
        break;
    }

    // = x.y
    case knopDot:
    {
        // get field id for "y"
        Js::PropertyId propertyId = lhs->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();
        funcInfo->AcquireLoc(lhs);
        EmitReference(lhs, byteCodeGenerator, funcInfo);
        uint cacheId = funcInfo->FindOrAddInlineCacheId(lhs->AsParseNodeBin()->pnode1->location, propertyId, false, false);
        byteCodeGenerator->Writer()->PatchableProperty(Js::OpCode::LdFld, lhs->location, lhs->AsParseNodeBin()->pnode1->location, cacheId);
        break;
    }

    case knopIndex:
        funcInfo->AcquireLoc(lhs);
        EmitReference(lhs, byteCodeGenerator, funcInfo);
        byteCodeGenerator->Writer()->Element(
            Js::OpCode::LdElemI_A, lhs->location, lhs->AsParseNodeBin()->pnode1->location, lhs->AsParseNodeBin()->pnode2->location);
        break;

        // f(x) +=
    case knopCall:
    {
        ParseNodeCall * pnodeCallLhs = lhs->AsParseNodeCall();

        if (pnodeCallLhs->isSuperCall)
        {
            funcInfo->AcquireLoc(pnodeCallLhs);
            EmitReference(pnodeCallLhs, byteCodeGenerator, funcInfo);
            byteCodeGenerator->EmitSuperCall(funcInfo, pnodeCallLhs->AsParseNodeSuperCall(), /*fReturnValue=*/ false, /*fEvaluateComponents=*/ false);
        }
        else if (pnodeCallLhs->pnodeTarget->nop == knopImport)
        {
            ParseNodePtr args = pnodeCallLhs->pnodeArgs;
            Assert(CountArguments(args) == 2); // import() takes one argument
            Emit(args, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(args);
            funcInfo->AcquireLoc(pnodeCallLhs);
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::ImportCall, pnodeCallLhs->location, args->location);
        }
        else
        {
            funcInfo->AcquireLoc(pnodeCallLhs);
            EmitReference(pnodeCallLhs, byteCodeGenerator, funcInfo);
            EmitCall(pnodeCallLhs, byteCodeGenerator, funcInfo, /*fReturnValue=*/ false, /*fEvaluateComponents=*/ false);
        }
        break;
    }
    default:
        funcInfo->AcquireLoc(lhs);
        Emit(lhs, byteCodeGenerator, funcInfo, false);
        break;
    }
}